

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTBuilder.cpp
# Opt level: O2

void __thiscall AST::ASTBuilder::constructListAndInsertAsChild(ASTBuilder *this)

{
  stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_> *this_00;
  __type _Var1;
  _Elt_pointer ppAVar2;
  string *__lhs;
  string *__rhs;
  ASTNode *this_01;
  value_type B;
  vector<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> childrenToBeInserted;
  ASTNode *local_78;
  ASTNode *local_70;
  _Vector_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> local_68;
  string local_48;
  
  this_00 = &this->stack;
  ppAVar2 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar2 ==
      (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppAVar2 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  local_70 = ppAVar2[-1];
  std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::pop_back(&this_00->c);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::push_back
            ((vector<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *)&local_68,&local_70);
  while( true ) {
    ppAVar2 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppAVar2 ==
        (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppAVar2 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    __lhs = ASTNode::getName_abi_cxx11_(ppAVar2[-1]);
    __rhs = ASTNode::getName_abi_cxx11_(local_70);
    _Var1 = std::operator==(__lhs,__rhs);
    if (!_Var1) break;
    ppAVar2 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppAVar2 ==
        (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppAVar2 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    std::vector<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::push_back
              ((vector<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *)&local_68,ppAVar2 + -1);
    std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::pop_back(&this_00->c);
  }
  this_01 = (ASTNode *)operator_new(200);
  std::__cxx11::string::string((string *)&local_48,"calls",(allocator *)&local_78);
  Calls::Calls((Calls *)this_01,&local_48,(Token *)0x0);
  std::__cxx11::string::~string((string *)&local_48);
  ASTNode::addChildToLeft
            (this_01,(vector<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *)&local_68);
  local_78 = this_01;
  std::deque<AST::ASTNode*,std::allocator<AST::ASTNode*>>::emplace_back<AST::ASTNode*>
            ((deque<AST::ASTNode*,std::allocator<AST::ASTNode*>> *)this_00,&local_78);
  std::_Vector_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void AST::ASTBuilder::constructListAndInsertAsChild() {
    auto B = stack.top();
    stack.pop();
    std::vector<ASTNode *> childrenToBeInserted;
    childrenToBeInserted.push_back(B);
    while (stack.top()->getName() == B->getName()) {
        childrenToBeInserted.push_back(stack.top());
        stack.pop();
    }

    auto A = new Calls("calls", nullptr);
    A->addChildToLeft(childrenToBeInserted);
    stack.push(A);
}